

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

Result<wallet::SelectionResult> *
wallet::ChooseSelectionResult
          (Result<wallet::SelectionResult> *__return_storage_ptr__,Chain *chain,
          CAmount *nTargetValue,Groups *groups,CoinSelectionParams *coin_selection_params)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_header *p_Var5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pSVar11;
  pointer pSVar12;
  bool bVar13;
  T *pTVar14;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *__x;
  _Rb_tree_node_base *p_Var15;
  size_t *psVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  pointer this;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  __x_00;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  __it1;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  __it2;
  long in_FS_OFFSET;
  undefined1 auVar20 [12];
  vector<COutPoint,_std::allocator<COutPoint>_> outpoints;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  errors;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> results;
  Result<wallet::SelectionResult> bnb_result;
  void *local_288;
  COutPoint *pCStack_280;
  COutPoint *local_278;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  local_268;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> local_248;
  char *local_230;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_228;
  CAmount local_1f8;
  undefined8 uStack_1f0;
  _Storage<long,_true> local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  size_t sStack_1d0;
  undefined8 local_1c8;
  CAmount CStack_1c0;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 *local_178;
  undefined8 uStack_170;
  undefined1 local_168;
  undefined7 uStack_167;
  undefined1 uStack_160;
  undefined4 uStack_15f;
  undefined2 uStack_15b;
  undefined1 uStack_159;
  undefined8 *local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [112];
  __index_type local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_248.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_start = (SelectionResult *)0x0;
  local_248.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_finish = (SelectionResult *)0x0;
  local_268.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar17 = 400000;
  if ((coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged != false) {
    iVar17 = (coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>.
             _M_payload.super__Optional_payload_base<int>._M_payload._M_value;
  }
  iVar18 = iVar17 + coin_selection_params->tx_noinputs_size * -4;
  if (iVar18 == 0 || iVar17 < coin_selection_params->tx_noinputs_size * 4) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "Maximum transaction weight is less than transaction weight without inputs","");
    paVar4 = &local_58.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_58._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "Maximum transaction weight is less than transaction weight without inputs","");
    }
    else {
      local_f0._0_8_ = "Maximum transaction weight is less than transaction weight without inputs";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_f0);
    }
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar1;
    if (local_78 == &local_68) {
      *puVar1 = CONCAT71(uStack_67,local_68);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
           uStack_60;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                0x10) = CONCAT71(uStack_67,local_68);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
         local_70;
    local_70 = 0;
    local_68 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
         puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar4) {
      *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                         local_58.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
           local_58.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
           local_58._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                0x30) =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) =
         local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
    local_78 = &local_68;
    local_58._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    if (coin_selection_params->m_subtract_fee_outputs == false) {
      SelectCoinsBnB((Result<wallet::SelectionResult> *)local_f0,&groups->positive_group,
                     nTargetValue,&coin_selection_params->m_cost_of_change,iVar18);
      if (local_80 == '\x01') {
        pTVar14 = util::Result<wallet::SelectionResult>::value
                            ((Result<wallet::SelectionResult> *)local_f0);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_248,pTVar14);
      }
      else {
        bVar13 = HasErrorMsg((Result<wallet::SelectionResult> *)local_f0);
        if (bVar13) {
          std::
          vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
          ::emplace_back<util::Result<wallet::SelectionResult>>
                    ((vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
                      *)&local_268,(Result<wallet::SelectionResult> *)local_f0);
        }
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)local_f0)
      ;
    }
    iVar18 = iVar18 + coin_selection_params->change_output_size * -4;
    if ((iVar18 < 0) &&
       (local_248.
        super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_248.
        super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "Maximum transaction weight is too low, can not accommodate change output","");
      paVar4 = &local_110.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_110._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "Maximum transaction weight is too low, can not accommodate change output","");
      }
      else {
        local_f0._0_8_ = "Maximum transaction weight is too low, can not accommodate change output";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_110,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_f0);
      }
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar1;
      if (local_130 == &local_120) {
        *puVar1 = CONCAT71(uStack_11f,local_120);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
             uStack_118;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = local_130;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                  + 0x10) = CONCAT71(uStack_11f,local_120);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
           local_128;
      local_128 = 0;
      local_120 = 0;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
           puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar4) {
        *puVar1 = CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                           local_110.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
             local_110.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
             local_110._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                  + 0x30) =
             CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                      local_110.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) =
           local_110._M_string_length;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
      local_130 = &local_120;
      local_110._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      KnapsackSolver((Result<wallet::SelectionResult> *)local_f0,&groups->mixed_group,nTargetValue,
                     coin_selection_params->m_min_change_target,coin_selection_params->rng_fast,
                     iVar18);
      if (local_80 == '\x01') {
        pTVar14 = util::Result<wallet::SelectionResult>::value
                            ((Result<wallet::SelectionResult> *)local_f0);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_248,pTVar14);
      }
      else {
        bVar13 = HasErrorMsg((Result<wallet::SelectionResult> *)local_f0);
        if (bVar13) {
          std::
          vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
          ::emplace_back<util::Result<wallet::SelectionResult>>
                    ((vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
                      *)&local_268,(Result<wallet::SelectionResult> *)local_f0);
        }
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)local_f0)
      ;
      lVar19 = (coin_selection_params->m_long_term_feerate).nSatoshisPerK;
      lVar7 = lVar19 * 3;
      lVar6 = (coin_selection_params->m_effective_feerate).nSatoshisPerK;
      if (lVar6 != lVar7 && SBORROW8(lVar6,lVar7) == lVar6 + lVar19 * -3 < 0) {
        CoinGrinder((Result<wallet::SelectionResult> *)local_f0,&groups->positive_group,nTargetValue
                    ,coin_selection_params->m_min_change_target,iVar18);
        if (local_80 == '\x01') {
          pTVar14 = util::Result<wallet::SelectionResult>::value
                              ((Result<wallet::SelectionResult> *)local_f0);
          SelectionResult::RecalculateWaste
                    (pTVar14,coin_selection_params->min_viable_change,
                     coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
          pTVar14 = util::Result<wallet::SelectionResult>::value
                              ((Result<wallet::SelectionResult> *)local_f0);
          std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                    (&local_248,pTVar14);
        }
        else {
          bVar13 = HasErrorMsg((Result<wallet::SelectionResult> *)local_f0);
          if (bVar13) {
            std::
            vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
            ::emplace_back<util::Result<wallet::SelectionResult>>
                      ((vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
                        *)&local_268,(Result<wallet::SelectionResult> *)local_f0);
          }
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_f0);
      }
      SelectCoinsSRD((Result<wallet::SelectionResult> *)local_f0,&groups->positive_group,
                     *nTargetValue,coin_selection_params->m_change_fee,
                     coin_selection_params->rng_fast,iVar18);
      if (local_80 == '\x01') {
        pTVar14 = util::Result<wallet::SelectionResult>::value
                            ((Result<wallet::SelectionResult> *)local_f0);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_248,pTVar14);
      }
      else {
        bVar13 = HasErrorMsg((Result<wallet::SelectionResult> *)local_f0);
        if (bVar13) {
          std::
          vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
          ::emplace_back<util::Result<wallet::SelectionResult>>
                    ((vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
                      *)&local_268,(Result<wallet::SelectionResult> *)local_f0);
        }
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)local_f0)
      ;
      pSVar11 = local_248.
                super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_248.
          super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        if (local_268.
            super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_268.
            super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_158 = &local_148;
          local_178 = &local_168;
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
               (undefined1 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x10);
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._M_first.
          _M_storage._M_storage[0x10] = '\0';
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x11)
               = 0;
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x19)
               = 0;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x1d)
               = 0;
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._M_first.
          _M_storage._M_storage[0x1f] = '\0';
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
               0;
          *(undefined1 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20)
               = (undefined1 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                 0x30);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30)
               = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38)
               = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28)
               = 0;
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
          uStack_140 = 0;
          local_148 = 0;
          uStack_150 = 0;
          uStack_159 = 0;
          uStack_15b = 0;
          uStack_15f = 0;
          uStack_160 = 0;
          uStack_167 = 0;
          local_168 = 0;
          uStack_170 = 0;
        }
        else {
          std::__detail::__variant::_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult>::
          _Move_ctor_base((_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                          __return_storage_ptr__,
                          (_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_268.
                          super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                 0x10);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                 0x30);
        this = local_248.
               super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
               ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_288 = (void *)0x0;
          pCStack_280 = (COutPoint *)0x0;
          local_278 = (COutPoint *)0x0;
          __x = &SelectionResult::GetInputSet(this)->_M_t;
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      *)local_f0,__x);
          lVar19 = 0;
          for (p_Var15 = (_Rb_tree_node_base *)local_f0._24_8_;
              p_Var15 != (_Rb_tree_node_base *)(local_f0 + 8);
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
            lVar6 = *(long *)(p_Var15 + 1);
            if (*(int *)(lVar6 + 0x70) < 1) {
              if (pCStack_280 == local_278) {
                std::vector<COutPoint,std::allocator<COutPoint>>::
                _M_realloc_insert<COutPoint_const&>
                          ((vector<COutPoint,std::allocator<COutPoint>> *)&local_288,
                           (iterator)pCStack_280,(COutPoint *)(lVar6 + 0x20));
              }
              else {
                pCStack_280->n = *(uint32_t *)(lVar6 + 0x40);
                uVar8 = *(undefined8 *)
                         (((COutPoint *)(lVar6 + 0x20))->hash).m_wrapped.super_base_blob<256U>.
                         m_data._M_elems;
                uVar9 = *(undefined8 *)(lVar6 + 0x28);
                uVar10 = *(undefined8 *)(lVar6 + 0x38);
                *(undefined8 *)
                 ((pCStack_280->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
                     *(undefined8 *)(lVar6 + 0x30);
                *(undefined8 *)
                 ((pCStack_280->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
                     uVar10;
                *(undefined8 *)(pCStack_280->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
                     uVar8;
                *(undefined8 *)
                 ((pCStack_280->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar9;
                pCStack_280 = pCStack_280 + 1;
              }
              lVar19 = lVar19 + *(long *)(*(long *)(p_Var15 + 1) + 0x98);
            }
          }
          auVar20 = (**(code **)(*(long *)chain + 0xc0))
                              (chain,(vector<COutPoint,std::allocator<COutPoint>> *)&local_288,
                               &coin_selection_params->m_effective_feerate);
          if ((auVar20 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
            local_1b8 = &local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b8,
                       "Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions."
                       ,"");
            if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0)
            {
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_198,
                         "Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions."
                         ,"");
            }
            else {
              local_230 = 
              "Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions."
              ;
              (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                        (&local_198,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_230);
            }
            *(undefined8 **)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::SelectionResult>.
              super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar1;
            if (local_1b8 == &local_1a8) {
              *puVar1 = CONCAT71(uStack_1a7,local_1a8);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x18) = uStack_1a0;
            }
            else {
              *(undefined1 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = local_1b8;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                                super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>
                                ._M_u + 0x10) = CONCAT71(uStack_1a7,local_1a8);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8)
                 = local_1b0;
            local_1b0 = 0;
            local_1a8 = 0;
            *(undefined8 **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x20) = puVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p == &local_198.field_2) {
              *puVar2 = CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                 local_198.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x38) = local_198.field_2._8_8_;
            }
            else {
              *(pointer *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x20) = local_198._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                                super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                                super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>
                                ._M_u + 0x30) =
                   CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                            local_198.field_2._M_local_buf[0]);
            }
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x28) = local_198._M_string_length;
            local_198._M_string_length = 0;
            local_198.field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
            local_1b8 = &local_1a8;
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          }
          else {
            lVar19 = lVar19 - auVar20._0_8_;
            if (lVar19 != 0) {
              SelectionResult::SetBumpFeeDiscount(this,lVar19);
            }
            SelectionResult::RecalculateWaste
                      (this,coin_selection_params->min_viable_change,
                       coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
          }
          _GLOBAL__N_1::std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)local_f0);
          if (local_288 != (void *)0x0) {
            operator_delete(local_288,(long)local_278 - (long)local_288);
          }
          pSVar12 = local_248.
                    super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((auVar20 & (undefined1  [12])0x1) == (undefined1  [12])0x0) goto LAB_00240ff6;
          this = this + 1;
        } while (this != pSVar11);
        __it1._M_current =
             local_248.
             super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
        __x_00._M_current =
             local_248.
             super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
             _M_impl.super__Vector_impl_data._M_start;
        if (__it1._M_current !=
            local_248.
            super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
            _M_impl.super__Vector_impl_data._M_finish &&
            local_248.
            super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_248.
            super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __it2._M_current =
               local_248.
               super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
               ._M_impl.super__Vector_impl_data._M_start;
          do {
            bVar13 = __gnu_cxx::__ops::_Iter_less_iter::operator()
                               ((_Iter_less_iter *)local_f0,__it1,__it2);
            __x_00._M_current = __it1._M_current;
            if (!bVar13) {
              __x_00._M_current = __it2._M_current;
            }
            __it1._M_current = __it1._M_current + 1;
            __it2._M_current = __x_00._M_current;
          } while (__it1._M_current != pSVar12);
        }
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::_Rb_tree(&local_228,
                   (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)__x_00._M_current);
        local_1f8 = (__x_00._M_current)->m_target;
        uStack_1f0._0_1_ = (__x_00._M_current)->m_algo;
        uStack_1f0._1_1_ = (__x_00._M_current)->m_use_effective;
        uStack_1f0._2_6_ = *(undefined6 *)&(__x_00._M_current)->field_0x3a;
        local_1e8 = ((__x_00._M_current)->m_waste).super__Optional_base<long,_true,_true>._M_payload
                    .super__Optional_payload_base<long>._M_payload;
        uStack_1e0 = *(undefined8 *)
                      &((__x_00._M_current)->m_waste).super__Optional_base<long,_true,_true>.
                       _M_payload.super__Optional_payload_base<long>._M_engaged;
        local_1d8 = *(undefined8 *)&(__x_00._M_current)->m_algo_completed;
        sStack_1d0 = (__x_00._M_current)->m_selections_evaluated;
        local_1c8 = *(undefined8 *)&(__x_00._M_current)->m_weight;
        CStack_1c0 = (__x_00._M_current)->bump_fee_group_discount;
        p_Var3 = (_Base_ptr)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                 8);
        if (local_228._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
               0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10)
               = 0;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18)
               = p_Var3;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20)
               = p_Var3;
          psVar16 = (size_t *)
                    ((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>.
                            _M_u + 0x28);
        }
        else {
          p_Var5 = &local_228._M_impl.super__Rb_tree_header;
          *(_Rb_tree_color *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
               local_228._M_impl.super__Rb_tree_header._M_header._M_color;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10)
               = local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18)
               = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20)
               = local_228._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var3;
          psVar16 = &local_228._M_impl.super__Rb_tree_header._M_node_count;
          *(size_t *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28)
               = local_228._M_impl.super__Rb_tree_header._M_node_count;
          local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
          local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
        }
        *psVar16 = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x60) =
             local_1c8;
        *(CAmount *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x68) =
             CStack_1c0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x50) =
             local_1d8;
        *(size_t *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x58) =
             sStack_1d0;
        *(_Storage<long,_true> *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x40) =
             local_1e8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x48) =
             uStack_1e0;
        *(CAmount *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30) =
             local_1f8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
             uStack_1f0;
        (__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\x01';
        _GLOBAL__N_1::std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&local_228);
      }
    }
  }
LAB_00240ff6:
  std::
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ::~vector(&local_268);
  std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::~vector
            (&local_248);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> ChooseSelectionResult(interfaces::Chain& chain, const CAmount& nTargetValue, Groups& groups, const CoinSelectionParams& coin_selection_params)
{
    // Vector of results. We will choose the best one based on waste.
    std::vector<SelectionResult> results;
    std::vector<util::Result<SelectionResult>> errors;
    auto append_error = [&] (util::Result<SelectionResult>&& result) {
        // If any specific error message appears here, then something different from a simple "no selection found" happened.
        // Let's save it, so it can be retrieved to the user if no other selection algorithm succeeded.
        if (HasErrorMsg(result)) {
            errors.emplace_back(std::move(result));
        }
    };

    // Maximum allowed weight for selected coins.
    int max_transaction_weight = coin_selection_params.m_max_tx_weight.value_or(MAX_STANDARD_TX_WEIGHT);
    int tx_weight_no_input = coin_selection_params.tx_noinputs_size * WITNESS_SCALE_FACTOR;
    int max_selection_weight = max_transaction_weight - tx_weight_no_input;
    if (max_selection_weight <= 0) {
        return util::Error{_("Maximum transaction weight is less than transaction weight without inputs")};
    }

    // SFFO frequently causes issues in the context of changeless input sets: skip BnB when SFFO is active
    if (!coin_selection_params.m_subtract_fee_outputs) {
        if (auto bnb_result{SelectCoinsBnB(groups.positive_group, nTargetValue, coin_selection_params.m_cost_of_change, max_selection_weight)}) {
            results.push_back(*bnb_result);
        } else append_error(std::move(bnb_result));
    }

    // Deduct change weight because remaining Coin Selection algorithms can create change output
    int change_outputs_weight = coin_selection_params.change_output_size * WITNESS_SCALE_FACTOR;
    max_selection_weight -= change_outputs_weight;
    if (max_selection_weight < 0 && results.empty()) {
        return util::Error{_("Maximum transaction weight is too low, can not accommodate change output")};
    }

    // The knapsack solver has some legacy behavior where it will spend dust outputs. We retain this behavior, so don't filter for positive only here.
    if (auto knapsack_result{KnapsackSolver(groups.mixed_group, nTargetValue, coin_selection_params.m_min_change_target, coin_selection_params.rng_fast, max_selection_weight)}) {
        results.push_back(*knapsack_result);
    } else append_error(std::move(knapsack_result));

    if (coin_selection_params.m_effective_feerate > CFeeRate{3 * coin_selection_params.m_long_term_feerate}) { // Minimize input set for feerates of at least 3×LTFRE (default: 30 ṩ/vB+)
        if (auto cg_result{CoinGrinder(groups.positive_group, nTargetValue, coin_selection_params.m_min_change_target, max_selection_weight)}) {
            cg_result->RecalculateWaste(coin_selection_params.min_viable_change, coin_selection_params.m_cost_of_change, coin_selection_params.m_change_fee);
            results.push_back(*cg_result);
        } else {
            append_error(std::move(cg_result));
        }
    }

    if (auto srd_result{SelectCoinsSRD(groups.positive_group, nTargetValue, coin_selection_params.m_change_fee, coin_selection_params.rng_fast, max_selection_weight)}) {
        results.push_back(*srd_result);
    } else append_error(std::move(srd_result));

    if (results.empty()) {
        // No solution found, retrieve the first explicit error (if any).
        // future: add 'severity level' to errors so the worst one can be retrieved instead of the first one.
        return errors.empty() ? util::Error() : std::move(errors.front());
    }

    // If the chosen input set has unconfirmed inputs, check for synergies from overlapping ancestry
    for (auto& result : results) {
        std::vector<COutPoint> outpoints;
        std::set<std::shared_ptr<COutput>> coins = result.GetInputSet();
        CAmount summed_bump_fees = 0;
        for (auto& coin : coins) {
            if (coin->depth > 0) continue; // Bump fees only exist for unconfirmed inputs
            outpoints.push_back(coin->outpoint);
            summed_bump_fees += coin->ancestor_bump_fees;
        }
        std::optional<CAmount> combined_bump_fee = chain.calculateCombinedBumpFee(outpoints, coin_selection_params.m_effective_feerate);
        if (!combined_bump_fee.has_value()) {
            return util::Error{_("Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions.")};
        }
        CAmount bump_fee_overestimate = summed_bump_fees - combined_bump_fee.value();
        if (bump_fee_overestimate) {
            result.SetBumpFeeDiscount(bump_fee_overestimate);
        }
        result.RecalculateWaste(coin_selection_params.min_viable_change, coin_selection_params.m_cost_of_change, coin_selection_params.m_change_fee);
    }

    // Choose the result with the least waste
    // If the waste is the same, choose the one which spends more inputs.
    return *std::min_element(results.begin(), results.end());
}